

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::Image::ImageTests::addCreateTexture2DActions(ImageTests *this,string *prefix)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,prefix,"rgb8");
  addCreateTexture(this,&bStack_38,0x30b1,0x1907,0x1907,0x1401);
  std::__cxx11::string::~string((string *)&bStack_38);
  std::operator+(&bStack_38,prefix,"rgb565");
  addCreateTexture(this,&bStack_38,0x30b1,0x1907,0x1907,0x8363);
  std::__cxx11::string::~string((string *)&bStack_38);
  std::operator+(&bStack_38,prefix,"rgba8");
  addCreateTexture(this,&bStack_38,0x30b1,0x1908,0x1908,0x1401);
  std::__cxx11::string::~string((string *)&bStack_38);
  std::operator+(&bStack_38,prefix,"rgb5_a1");
  addCreateTexture(this,&bStack_38,0x30b1,0x1908,0x1908,0x8034);
  std::__cxx11::string::~string((string *)&bStack_38);
  std::operator+(&bStack_38,prefix,"rgba4");
  addCreateTexture(this,&bStack_38,0x30b1,0x1908,0x1908,0x8033);
  std::__cxx11::string::~string((string *)&bStack_38);
  return;
}

Assistant:

void ImageTests::addCreateTexture2DActions (const string& prefix)
{
	addCreateTexture(prefix + "rgb8",		EGL_GL_TEXTURE_2D_KHR,	GL_RGB,		GL_RGB,		GL_UNSIGNED_BYTE);
	addCreateTexture(prefix + "rgb565",		EGL_GL_TEXTURE_2D_KHR,	GL_RGB,		GL_RGB,		GL_UNSIGNED_SHORT_5_6_5);
	addCreateTexture(prefix + "rgba8",		EGL_GL_TEXTURE_2D_KHR,	GL_RGBA,	GL_RGBA,	GL_UNSIGNED_BYTE);
	addCreateTexture(prefix + "rgb5_a1",	EGL_GL_TEXTURE_2D_KHR,	GL_RGBA,	GL_RGBA,	GL_UNSIGNED_SHORT_5_5_5_1);
	addCreateTexture(prefix + "rgba4",		EGL_GL_TEXTURE_2D_KHR,	GL_RGBA,	GL_RGBA,	GL_UNSIGNED_SHORT_4_4_4_4);
}